

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O1

Intersectors * __thiscall
embree::BVH8Factory::BVH8GridMBIntersectors
          (Intersectors *__return_storage_ptr__,BVH8Factory *this,BVH8 *bvh,
          IntersectVariant ivariant)

{
  (__return_storage_ptr__->intersector1).intersect = (IntersectFunc)0x0;
  (__return_storage_ptr__->intersector1).occluded = (OccludedFunc)0x0;
  (__return_storage_ptr__->collider).collide = (CollideFunc)0x0;
  (__return_storage_ptr__->collider).name = (char *)0x0;
  __return_storage_ptr__->ptr = (AccelData *)0x0;
  __return_storage_ptr__->leafIntersector = (void *)0x0;
  memset(&(__return_storage_ptr__->intersector1).name,0,0xe0);
  __return_storage_ptr__->ptr = &bvh->super_AccelData;
  (*this->BVH8GridMBIntersector1Moeller)(&__return_storage_ptr__->intersector1);
  (__return_storage_ptr__->intersector4).name = (char *)0x0;
  (__return_storage_ptr__->intersector4).intersect = (IntersectFunc4)0x0;
  (__return_storage_ptr__->intersector4).occluded = (OccludedFunc4)0x0;
  (__return_storage_ptr__->intersector8).intersect = (IntersectFunc8)0x0;
  (__return_storage_ptr__->intersector8).occluded = (OccludedFunc8)0x0;
  (__return_storage_ptr__->intersector8).name = (char *)0x0;
  (__return_storage_ptr__->intersector16).intersect = (IntersectFunc16)0x0;
  (__return_storage_ptr__->intersector16).occluded = (OccludedFunc16)0x0;
  (__return_storage_ptr__->intersector16).name = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Accel::Intersectors BVH8Factory::BVH8GridMBIntersectors(BVH8* bvh, IntersectVariant ivariant)
  {
    Accel::Intersectors intersectors;
    intersectors.ptr = bvh;
    intersectors.intersector1  = BVH8GridMBIntersector1Moeller();
#if defined (EMBREE_RAY_PACKETS)
    intersectors.intersector4  = nullptr;
    intersectors.intersector8  = nullptr;
    intersectors.intersector16 = nullptr;
#endif
    return intersectors;
  }